

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O2

void __thiscall kratos::InterfaceDefinition::~InterfaceDefinition(InterfaceDefinition *this)

{
  ~InterfaceDefinition(this);
  operator_delete(this,200);
  return;
}

Assistant:

explicit InterfaceDefinition(std::string name) : name_(std::move(name)) {}